

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O2

void __thiscall t_xml_generator::close_top_element(t_xml_generator *this)

{
  size_type sVar1;
  ostream *poVar2;
  
  if (this->top_element_is_open == true) {
    this->top_element_is_open = false;
    sVar1 = std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(this->elements_).c);
    if ((sVar1 != 0) && (this->top_element_is_empty == true)) {
      poVar2 = std::operator<<((ostream *)&this->f_xml_,">");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      return;
    }
  }
  return;
}

Assistant:

void t_xml_generator::close_top_element() {
  if( top_element_is_open) {
    top_element_is_open = false;
    if (elements_.size() > 0 && top_element_is_empty) {
      f_xml_ << ">" << endl;
    }
  }
}